

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void pumpChildStdio(int childStdinFd,int childStdoutFd,int childStderrFd)

{
  bool bVar1;
  int in_EDX;
  int in_ESI;
  fd_set readSet;
  int selectFd;
  int tmp;
  int result;
  int in_stack_00000fa0;
  int in_stack_00000fa4;
  char *in_stack_00000fa8;
  int local_a0;
  int local_9c;
  fd_set local_98;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  int local_8;
  
  local_9c = in_EDX;
  if (in_EDX < in_ESI) {
    local_9c = in_ESI;
  }
  local_14 = local_9c;
  if (local_9c < 1) {
    local_a0 = 0;
  }
  else {
    local_a0 = local_9c;
  }
  local_18 = local_a0 + 1;
  local_c = in_EDX;
  local_8 = in_ESI;
  do {
    memset(&local_98,0,0x80);
    local_98.fds_bits[0] = local_98.fds_bits[0] | 1;
    local_98.fds_bits[local_8 / 0x40] =
         1L << ((byte)((long)local_8 % 0x40) & 0x3f) | local_98.fds_bits[local_8 / 0x40];
    if (local_c != -1) {
      local_98.fds_bits[local_c / 0x40] =
           1L << ((byte)((long)local_c % 0x40) & 0x3f) | local_98.fds_bits[local_c / 0x40];
    }
    local_10 = select(local_18,&local_98,(fd_set *)0x0,(fd_set *)0x0,(timeval *)0x0);
  } while ((((local_10 != -1) &&
            (((local_98.fds_bits[0] & 1U) == 0 ||
             (bVar1 = pump(in_stack_00000fa8,in_stack_00000fa4,in_stack_00000fa0), bVar1)))) &&
           (((local_98.fds_bits[local_8 / 0x40] & 1L << ((byte)((long)local_8 % 0x40) & 0x3f)) == 0
            || (bVar1 = pump(in_stack_00000fa8,in_stack_00000fa4,in_stack_00000fa0), bVar1)))) &&
          (((local_98.fds_bits[local_c / 0x40] & 1L << ((byte)((long)local_c % 0x40) & 0x3f)) == 0
           || (bVar1 = pump(in_stack_00000fa8,in_stack_00000fa4,in_stack_00000fa0), bVar1))));
  printf("PROCESS FINISHED!\n");
  return;
}

Assistant:

void
pumpChildStdio(
	int childStdinFd,
	int childStdoutFd,
	int childStderrFd
) {
	int result;
	int tmp = AXL_MAX(childStdoutFd, childStderrFd);
	int selectFd = AXL_MAX(tmp, STDIN_FILENO) + 1;

	for (;;) {
		fd_set readSet = { 0 };

		FD_SET(STDIN_FILENO, &readSet);
		FD_SET(childStdoutFd, &readSet);

		if (childStderrFd != -1)
			FD_SET(childStderrFd, &readSet);

		result = ::select(selectFd, &readSet, NULL, NULL, NULL);
		if (result == -1)
			break;

		if (FD_ISSET(STDIN_FILENO, &readSet))
			if (!pump("STDIN", STDIN_FILENO, childStdinFd))
				break;

		if (FD_ISSET(childStdoutFd, &readSet))
			if (!pump("STDOUT", childStdoutFd, STDOUT_FILENO))
				break;

		if (FD_ISSET(childStderrFd, &readSet))
			if (!pump("STDERR", childStderrFd, STDERR_FILENO))
				break;
	}

	printf("PROCESS FINISHED!\n");
}